

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Section::Section(Section *this,SectionInfo *info)

{
  IRunContext *pIVar1;
  int iVar2;
  uint64_t uVar3;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00167ef8;
  SectionInfo::SectionInfo(&this->m_info,info);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_assertions).failedButOk = 0;
  (this->m_assertions).passed = 0;
  (this->m_assertions).failed = 0;
  pIVar1 = info->runContext;
  this->m_runContext = pIVar1;
  iVar2 = (*pIVar1->_vptr_IRunContext[3])(pIVar1,&this->m_info,&this->m_assertions);
  this->m_sectionIncluded = SUB41(iVar2,0);
  (this->m_timer).m_ticks = 0;
  uVar3 = anon_unknown_24::getCurrentTicks();
  (this->m_timer).m_ticks = uVar3;
  return;
}

Assistant:

Section::Section( SectionInfo const& info )
    :   m_info( info ),
        m_runContext( *info.runContext ),
        m_sectionIncluded( m_runContext.sectionStarted( m_info, m_assertions ) )
    {
        m_timer.start();
    }